

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtContinuousConvexCollision.cpp
# Opt level: O1

void __thiscall
cbtContinuousConvexCollision::computeClosestPoints
          (cbtContinuousConvexCollision *this,cbtTransform *transA,cbtTransform *transB,
          cbtPointCollector *pointCollector)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  float fVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int shapeTypeA;
  int shapeTypeB;
  cbtConvexShape *pcVar14;
  cbtConvexShape *objectB;
  cbtStaticPlaneShape *pcVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  cbtScalar in_XMM0_Da;
  cbtScalar cVar34;
  cbtScalar acVar35 [4];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ClosestPointInput input;
  cbtGjkPairDetector gjk;
  ClosestPointInput local_128;
  cbtGjkPairDetector local_98;
  
  if (this->m_convexB1 == (cbtConvexShape *)0x0) {
    pcVar14 = this->m_convexA;
    pcVar15 = this->m_planeShape;
    cVar34 = (transA->m_basis).m_el[0].m_floats[0];
    cVar1 = (transA->m_basis).m_el[0].m_floats[1];
    cVar2 = (transA->m_basis).m_el[0].m_floats[2];
    fVar36 = (transA->m_basis).m_el[1].m_floats[0];
    fVar3 = (transA->m_basis).m_el[1].m_floats[1];
    cVar4 = (transA->m_basis).m_el[1].m_floats[2];
    cVar5 = (transA->m_basis).m_el[2].m_floats[0];
    cVar6 = (transA->m_basis).m_el[2].m_floats[1];
    cVar7 = (transA->m_basis).m_el[2].m_floats[2];
    cVar8 = (transA->m_origin).m_floats[0];
    cVar9 = (transA->m_origin).m_floats[1];
    cVar10 = (transA->m_origin).m_floats[2];
    cbtTransform::inverse(transB);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * local_128.m_transformA.m_basis.m_el[0].
                                                      m_floats[1])),ZEXT416((uint)cVar34),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[0]));
    auVar32 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar5),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[2]));
    auVar19 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * local_128.m_transformA.m_basis.m_el[0].
                                                         m_floats[1])),ZEXT416((uint)cVar1),
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[0]))
    ;
    auVar20 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)cVar6),
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[2]))
    ;
    auVar19 = vmulss_avx512f(ZEXT416((uint)cVar4),
                             ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[1]));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[0]));
    auVar21 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)cVar7),
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[2]))
    ;
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * local_128.m_transformA.m_basis.m_el[1].
                                                      m_floats[1])),ZEXT416((uint)cVar34),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[0]));
    auVar37 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar5),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[2]));
    auVar19 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * local_128.m_transformA.m_basis.m_el[1].
                                                         m_floats[1])),ZEXT416((uint)cVar1),
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[0]))
    ;
    auVar22 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)cVar6),
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[2]))
    ;
    auVar19 = vmulss_avx512f(ZEXT416((uint)cVar4),
                             ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[1]));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[0]));
    auVar23 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)cVar7),
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[2]))
    ;
    auVar39 = ZEXT416((uint)cVar34);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * local_128.m_transformA.m_basis.m_el[2].
                                                      m_floats[1])),auVar39,
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[0]));
    auVar26 = ZEXT416((uint)cVar5);
    auVar38 = vfmadd231ss_fma(auVar19,auVar26,
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[2]));
    auVar29 = ZEXT416((uint)cVar1);
    auVar19 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * local_128.m_transformA.m_basis.m_el[2].
                                                         m_floats[1])),auVar29,
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[0]))
    ;
    auVar30 = ZEXT416((uint)cVar6);
    auVar24 = vfmadd231ss_avx512f(auVar19,auVar30,
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[2]))
    ;
    auVar45 = ZEXT416((uint)cVar4);
    auVar19 = vmulss_avx512f(auVar45,ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats
                                                   [1]));
    auVar43 = ZEXT416((uint)cVar2);
    auVar19 = vfmadd231ss_fma(auVar19,auVar43,
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[0]));
    auVar44 = ZEXT416((uint)cVar7);
    auVar25 = vfmadd231ss_avx512f(auVar19,auVar44,
                                  ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[2]))
    ;
    auVar19 = vmulss_avx512f(ZEXT416((uint)cVar9),
                             ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[1]));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar8),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[0]));
    auVar40 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar10),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[0].m_floats[2]));
    auVar19 = vmulss_avx512f(ZEXT416((uint)cVar9),
                             ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[1]));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar8),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[0]));
    auVar41 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar10),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[1].m_floats[2]));
    auVar19 = vmulss_avx512f(ZEXT416((uint)cVar9),
                             ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[1]));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar8),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[0]));
    auVar42 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar10),
                              ZEXT416((uint)local_128.m_transformA.m_basis.m_el[2].m_floats[2]));
    fVar11 = (transB->m_basis).m_el[1].m_floats[0];
    cVar34 = (transB->m_basis).m_el[0].m_floats[0];
    cVar1 = (transB->m_basis).m_el[0].m_floats[1];
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * fVar11)),ZEXT416((uint)cVar34),auVar39);
    cVar2 = (transB->m_basis).m_el[2].m_floats[0];
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),auVar26);
    fVar12 = (transB->m_basis).m_el[1].m_floats[1];
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * fVar12)),ZEXT416((uint)cVar1),auVar39);
    cVar4 = (transB->m_basis).m_el[2].m_floats[1];
    auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)cVar4),auVar26);
    cVar5 = (transB->m_basis).m_el[0].m_floats[2];
    fVar13 = (transB->m_basis).m_el[1].m_floats[2];
    auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * fVar13)),ZEXT416((uint)cVar5),auVar39);
    cVar6 = (transB->m_basis).m_el[2].m_floats[2];
    auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)cVar6),auVar26);
    auVar26 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * fVar11)),ZEXT416((uint)cVar34),auVar29);
    auVar27 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar2),auVar30);
    auVar26 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * fVar12)),ZEXT416((uint)cVar1),auVar29);
    auVar28 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar4),auVar30);
    auVar26 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar3 * fVar13)),ZEXT416((uint)cVar5),auVar29);
    auVar29 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar6),auVar30);
    auVar26 = vmulss_avx512f(auVar45,ZEXT416((uint)fVar11));
    auVar26 = vfmadd231ss_fma(auVar26,auVar43,ZEXT416((uint)cVar34));
    auVar30 = vfmadd231ss_avx512f(auVar26,auVar44,ZEXT416((uint)cVar2));
    auVar26 = vmulss_avx512f(auVar45,ZEXT416((uint)fVar12));
    auVar26 = vfmadd231ss_fma(auVar26,auVar43,ZEXT416((uint)cVar1));
    auVar31 = vfmadd231ss_avx512f(auVar26,auVar44,ZEXT416((uint)cVar4));
    auVar26 = vmulss_avx512f(auVar45,ZEXT416((uint)fVar13));
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar5),auVar43);
    auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar6),auVar44);
    cVar34 = (pcVar15->m_planeNormal).m_floats[0];
    fVar36 = (pcVar15->m_planeNormal).m_floats[1];
    cVar1 = (pcVar15->m_planeNormal).m_floats[2];
    auVar19 = vfnmsub231ss_fma(ZEXT416((uint)(auVar33._0_4_ * fVar36)),ZEXT416((uint)cVar34),auVar19
                              );
    auVar19 = vfnmadd231ss_fma(auVar19,ZEXT416((uint)cVar1),auVar39);
    auVar33 = vfnmsub231ss_fma(ZEXT416((uint)(auVar28._0_4_ * fVar36)),ZEXT416((uint)cVar34),auVar27
                              );
    auVar33 = vfnmadd231ss_fma(auVar33,ZEXT416((uint)cVar1),auVar29);
    auVar19 = vinsertps_avx(auVar19,auVar33,0x10);
    auVar33 = vfnmsub231ss_fma(ZEXT416((uint)(auVar31._0_4_ * fVar36)),ZEXT416((uint)cVar34),auVar30
                              );
    auVar33 = vfnmadd231ss_fma(auVar33,ZEXT416((uint)cVar1),auVar26);
    acVar35 = (cbtScalar  [4])vinsertps_avx(auVar19,auVar33,0x28);
    local_128.m_transformA.m_basis.m_el[0].m_floats = acVar35;
    (*(pcVar14->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])(pcVar14,&local_128);
    auVar33 = vmovshdup_avx((undefined1  [16])acVar35);
    fVar36 = auVar33._0_4_;
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * auVar20._0_4_)),(undefined1  [16])acVar35,
                              ZEXT416(auVar32._0_4_));
    auVar33 = vfmadd231ss_fma(auVar33,auVar19,ZEXT416(auVar21._0_4_));
    fVar16 = auVar33._0_4_ + auVar40._0_4_ + local_128.m_transformA.m_origin.m_floats[0];
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * auVar22._0_4_)),(undefined1  [16])acVar35,
                              ZEXT416(auVar37._0_4_));
    auVar33 = vfmadd231ss_fma(auVar33,auVar19,ZEXT416(auVar23._0_4_));
    fVar17 = auVar33._0_4_ + auVar41._0_4_ + local_128.m_transformA.m_origin.m_floats[1];
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * auVar24._0_4_)),(undefined1  [16])acVar35,
                              ZEXT416(auVar38._0_4_));
    auVar19 = vfmadd231ss_fma(auVar33,auVar19,ZEXT416(auVar25._0_4_));
    fVar18 = auVar19._0_4_ + auVar42._0_4_ + local_128.m_transformA.m_origin.m_floats[2];
    fVar36 = (pcVar15->m_planeNormal).m_floats[0];
    fVar3 = (pcVar15->m_planeNormal).m_floats[1];
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar17)),ZEXT416((uint)fVar36),
                              ZEXT416((uint)fVar16));
    fVar11 = (pcVar15->m_planeNormal).m_floats[2];
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar11),ZEXT416((uint)fVar18));
    fVar12 = auVar19._0_4_ - pcVar15->m_planeConstant;
    fVar16 = fVar16 - fVar36 * fVar12;
    fVar17 = fVar17 - fVar3 * fVar12;
    fVar18 = fVar18 - fVar11 * fVar12;
    fVar12 = (transB->m_basis).m_el[0].m_floats[1];
    auVar38 = ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar17)),ZEXT416((uint)fVar16),auVar38);
    auVar40 = ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar18),auVar40);
    fVar13 = (transB->m_basis).m_el[1].m_floats[1];
    auVar41 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]);
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar17)),ZEXT416((uint)fVar16),auVar41);
    auVar42 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]);
    auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar18),auVar42);
    auVar26 = ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[1]);
    auVar32 = vmulss_avx512f(ZEXT416((uint)fVar17),auVar26);
    auVar39 = ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]);
    auVar32 = vfmadd231ss_fma(auVar32,auVar39,ZEXT416((uint)fVar16));
    auVar37 = ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]);
    auVar32 = vfmadd231ss_fma(auVar32,auVar37,ZEXT416((uint)fVar18));
    auVar19 = vinsertps_avx(ZEXT416((uint)(auVar19._0_4_ + (transB->m_origin).m_floats[0])),
                            ZEXT416((uint)(auVar33._0_4_ + (transB->m_origin).m_floats[1])),0x10);
    local_128.m_transformA.m_basis.m_el[0].m_floats =
         (cbtScalar  [4])
         vinsertps_avx(auVar19,ZEXT416((uint)(auVar32._0_4_ + (transB->m_origin).m_floats[2])),0x28)
    ;
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar3)),ZEXT416((uint)fVar36),auVar38);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar11),auVar40);
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar3)),ZEXT416((uint)fVar36),auVar41);
    auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar11),auVar42);
    auVar19 = vinsertps_avx(auVar19,auVar33,0x10);
    auVar33 = vmulss_avx512f(ZEXT416((uint)fVar3),auVar26);
    auVar33 = vfmadd231ss_fma(auVar33,auVar39,ZEXT416((uint)fVar36));
    auVar33 = vfmadd231ss_fma(auVar33,auVar37,ZEXT416((uint)fVar11));
    local_98._0_16_ = vinsertps_avx(auVar19,auVar33,0x28);
    (*(pointCollector->super_Result)._vptr_Result[4])(pointCollector,&local_98,&local_128);
  }
  else {
    cbtVoronoiSimplexSolver::reset(this->m_simplexSolver);
    pcVar14 = this->m_convexA;
    objectB = this->m_convexB1;
    shapeTypeA = (pcVar14->super_cbtCollisionShape).m_shapeType;
    shapeTypeB = (objectB->super_cbtCollisionShape).m_shapeType;
    (*(pcVar14->super_cbtCollisionShape)._vptr_cbtCollisionShape[0xc])(pcVar14);
    cVar34 = in_XMM0_Da;
    (*(this->m_convexB1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0xc])();
    cbtGjkPairDetector::cbtGjkPairDetector
              (&local_98,pcVar14,objectB,shapeTypeA,shapeTypeB,in_XMM0_Da,cVar34,
               this->m_simplexSolver,this->m_penetrationDepthSolver);
    local_128.m_maximumDistanceSquared = 1e+18;
    local_128.m_transformA.m_basis.m_el[0].m_floats = *&(transA->m_basis).m_el[0].m_floats;
    local_128.m_transformA.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
    local_128.m_transformA.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[1].m_floats + 2);
    local_128.m_transformA.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
    local_128.m_transformA.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[2].m_floats + 2);
    local_128.m_transformA.m_origin.m_floats._0_8_ = *(undefined8 *)(transA->m_origin).m_floats;
    local_128.m_transformA.m_origin.m_floats._8_8_ =
         *(undefined8 *)((transA->m_origin).m_floats + 2);
    local_128.m_transformB.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
    local_128.m_transformB.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
    local_128.m_transformB.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
    local_128.m_transformB.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[1].m_floats + 2);
    local_128.m_transformB.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
    local_128.m_transformB.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[2].m_floats + 2);
    local_128.m_transformB.m_origin.m_floats._0_8_ = *(undefined8 *)(transB->m_origin).m_floats;
    local_128.m_transformB.m_origin.m_floats._8_8_ =
         *(undefined8 *)((transB->m_origin).m_floats + 2);
    cbtGjkPairDetector::getClosestPoints
              (&local_98,&local_128,&pointCollector->super_Result,(cbtIDebugDraw *)0x0,false);
  }
  return;
}

Assistant:

void cbtContinuousConvexCollision::computeClosestPoints(const cbtTransform& transA, const cbtTransform& transB, cbtPointCollector& pointCollector)
{
	if (m_convexB1)
	{
		m_simplexSolver->reset();
		cbtGjkPairDetector gjk(m_convexA, m_convexB1, m_convexA->getShapeType(), m_convexB1->getShapeType(), m_convexA->getMargin(), m_convexB1->getMargin(), m_simplexSolver, m_penetrationDepthSolver);
		cbtGjkPairDetector::ClosestPointInput input;
		input.m_transformA = transA;
		input.m_transformB = transB;
		gjk.getClosestPoints(input, pointCollector, 0);
	}
	else
	{
		//convex versus plane
		const cbtConvexShape* convexShape = m_convexA;
		const cbtStaticPlaneShape* planeShape = m_planeShape;

		const cbtVector3& planeNormal = planeShape->getPlaneNormal();
		const cbtScalar& planeConstant = planeShape->getPlaneConstant();

		cbtTransform convexWorldTransform = transA;
		cbtTransform convexInPlaneTrans;
		convexInPlaneTrans = transB.inverse() * convexWorldTransform;
		cbtTransform planeInConvex;
		planeInConvex = convexWorldTransform.inverse() * transB;

		cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);

		cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
		cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

		cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
		cbtVector3 vtxInPlaneWorld = transB * vtxInPlaneProjected;
		cbtVector3 normalOnSurfaceB = transB.getBasis() * planeNormal;

		pointCollector.addContactPoint(
			normalOnSurfaceB,
			vtxInPlaneWorld,
			distance);
	}
}